

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

QString * __thiscall
QtMWidgets::PickerPrivate::itemText
          (QString *__return_storage_ptr__,PickerPrivate *this,QModelIndex *index)

{
  bool bVar1;
  QVariant QStack_38;
  
  bVar1 = false;
  if ((-1 < index->r) && (bVar1 = false, -1 < index->c)) {
    bVar1 = index->m != (QAbstractItemModel *)0x0;
  }
  if (bVar1) {
    (**(code **)(*(long *)this->model + 0x90))(&QStack_38,this->model,index,0);
    QVariant::toString();
    QVariant::~QVariant(&QStack_38);
  }
  else {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QString
PickerPrivate::itemText( const QModelIndex & index ) const
{
	return index.isValid() ? model->data( index, Qt::DisplayRole ).toString() :
		QString();
}